

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetDeviceGetConcurrentMetricGroupsExp
          (zet_device_handle_t hDevice,uint32_t metricGroupCount,
          zet_metric_group_handle_t *phMetricGroups,uint32_t *pMetricGroupsCountPerConcurrentGroup,
          uint32_t *pConcurrentGroupCount)

{
  zet_pfnDeviceGetConcurrentMetricGroupsExp_t pfnGetConcurrentMetricGroupsExp;
  dditable_t *dditable;
  ze_result_t result;
  uint32_t *pConcurrentGroupCount_local;
  uint32_t *pMetricGroupsCountPerConcurrentGroup_local;
  zet_metric_group_handle_t *phMetricGroups_local;
  uint32_t metricGroupCount_local;
  zet_device_handle_t hDevice_local;
  
  if (*(code **)(*(long *)(hDevice + 8) + 0x6c8) == (code *)0x0) {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDevice_local._4_4_ =
         (**(code **)(*(long *)(hDevice + 8) + 0x6c8))
                   (*(undefined8 *)hDevice,metricGroupCount,phMetricGroups,
                    pMetricGroupsCountPerConcurrentGroup,pConcurrentGroupCount);
  }
  return hDevice_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDeviceGetConcurrentMetricGroupsExp(
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t metricGroupCount,                      ///< [in] metric group count
        zet_metric_group_handle_t * phMetricGroups,     ///< [in,out] metrics groups to be re-arranged to be sets of concurrent
                                                        ///< groups
        uint32_t * pMetricGroupsCountPerConcurrentGroup,///< [in,out][optional][*pConcurrentGroupCount] count of metric groups per
                                                        ///< concurrent group.
        uint32_t * pConcurrentGroupCount                ///< [out] number of concurrent groups.
                                                        ///< The value of this parameter could be used to determine the number of
                                                        ///< replays necessary.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_device_object_t*>( hDevice )->dditable;
        auto pfnGetConcurrentMetricGroupsExp = dditable->zet.DeviceExp.pfnGetConcurrentMetricGroupsExp;
        if( nullptr == pfnGetConcurrentMetricGroupsExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zet_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnGetConcurrentMetricGroupsExp( hDevice, metricGroupCount, phMetricGroups, pMetricGroupsCountPerConcurrentGroup, pConcurrentGroupCount );

        return result;
    }